

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_iterator.hpp
# Opt level: O1

join_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int>_>,_std::_Fwd_list_const_iterator<int>_>_>_>_>_>
* __thiscall
burst::
make_join_iterator<boost::iterator_range<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::_Fwd_list_const_iterator<int>>>,std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::_Fwd_list_const_iterator<int>>>>>>>>
          (join_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int>_>,_std::_Fwd_list_const_iterator<int>_>_>_>_>_>
           *__return_storage_ptr__,burst *this,
          iterator_range<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>_>_>_>_>
          *ranges)

{
  owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>_>_>_>
  *in_RCX;
  undefined8 local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  undefined8 local_28;
  owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>_>_>_>
  local_20;
  
  local_38 = *(undefined8 *)this;
  local_30 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    in_RCX = (owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>_>_>_>
              *)&__libc_single_threaded;
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_30->_M_use_count = local_30->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_30->_M_use_count = local_30->_M_use_count + 1;
    }
  }
  local_28 = *(undefined8 *)(this + 0x10);
  local_20.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = *(element_type **)(this + 0x18);
  local_20.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 0x20);
  if (local_20.m_container.
      super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    in_RCX = (owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>_>_>_>
              *)&__libc_single_threaded;
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_20.m_container.
       super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_20.m_container.
            super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_20.m_container.
       super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_20.m_container.
            super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_20.m_iterator._M_current =
       *(iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>
         **)(this + 0x28);
  make_join_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::_Fwd_list_const_iterator<int>>>,std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::_Fwd_list_const_iterator<int>>>>>>>
            (__return_storage_ptr__,(burst *)&local_38,&local_20,in_RCX);
  if (local_20.m_container.
      super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.m_container.
               super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Fwd_list_const_iterator<int>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

auto make_join_iterator (Range && ranges)
    {
        using std::begin;
        using std::end;
        return
            make_join_iterator
            (
                begin(std::forward<Range>(ranges)),
                end(std::forward<Range>(ranges))
            );
    }